

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O0

value_type * __thiscall
FadBinaryAdd<Fad<Fad<double>_>,_FadCst<double>_>::dx
          (FadBinaryAdd<Fad<Fad<double>_>,_FadCst<double>_> *this,int i)

{
  int in_EDX;
  Fad<Fad<double>_> *in_RSI;
  value_type *in_RDI;
  undefined4 in_stack_ffffffffffffffe8;
  
  Fad<Fad<double>_>::dx(in_RSI,in_EDX);
  Fad<double>::Fad((Fad<double> *)in_RSI,(Fad<double> *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8));
  return in_RDI;
}

Assistant:

const value_type dx(int i) const {return left_.dx(i);}